

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGetTestPropertyCommand.cxx
# Opt level: O2

bool cmGetTestPropertyCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  pointer pbVar1;
  cmMakefile *this;
  int iVar2;
  bool bVar3;
  cmTest *this_00;
  cmValue value;
  long lVar4;
  string *psVar5;
  string_view value_00;
  cmMakefile *test_directory_makefile;
  string test_directory;
  
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  lVar4 = (long)(args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1;
  if ((lVar4 >> 5 != 3) && (lVar4 >> 5 != 5)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_directory,"called with incorrect number of arguments",
               (allocator<char> *)&test_directory_makefile);
    std::__cxx11::string::_M_assign((string *)&status->Error);
    std::__cxx11::string::~string((string *)&test_directory);
    return false;
  }
  test_directory._M_dataplus._M_p = (pointer)&test_directory.field_2;
  test_directory._M_string_length = 0;
  test_directory.field_2._M_local_buf[0] = '\0';
  bVar3 = std::operator==(pbVar1 + 2,"DIRECTORY");
  if (lVar4 == 0xa0 && bVar3) {
    std::__cxx11::string::_M_assign((string *)&test_directory);
    iVar2 = 4;
  }
  else {
    iVar2 = 2;
  }
  test_directory_makefile = status->Makefile;
  bVar3 = SetPropertyCommand::HandleAndValidateTestDirectoryScopes
                    (status,lVar4 == 0xa0 && bVar3,&test_directory,&test_directory_makefile);
  if (bVar3) {
    psVar5 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    this = status->Makefile;
    this_00 = cmMakefile::GetTest(test_directory_makefile,psVar5);
    psVar5 = (string *)((long)&(psVar5->_M_dataplus)._M_p + (ulong)(uint)(iVar2 << 5));
    if (((this_00 == (cmTest *)0x0) ||
        (pbVar1 = (args->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start, pbVar1[1]._M_string_length == 0)) ||
       (value = cmTest::GetProperty(this_00,pbVar1 + 1), value.Value == (string *)0x0)) {
      value_00._M_str = "NOTFOUND";
      value_00._M_len = 8;
      cmMakefile::AddDefinition(this,psVar5,value_00);
    }
    else {
      cmMakefile::AddDefinition(this,psVar5,value);
    }
  }
  std::__cxx11::string::~string((string *)&test_directory);
  return bVar3;
}

Assistant:

bool cmGetTestPropertyCommand(std::vector<std::string> const& args,
                              cmExecutionStatus& status)
{
  std::vector<std::string>::size_type args_size = args.size();
  if (args_size != 3 && args_size != 5) {
    status.SetError("called with incorrect number of arguments");
    return false;
  }

  std::string test_directory;
  bool test_directory_option_enabled = false;

  int var_arg_index = 2;
  if (args[2] == "DIRECTORY" && args_size == 5) {
    var_arg_index = 4;
    test_directory_option_enabled = true;
    test_directory = args[3];
  }

  cmMakefile* test_directory_makefile = &status.GetMakefile();
  bool file_scopes_handled =
    SetPropertyCommand::HandleAndValidateTestDirectoryScopes(
      status, test_directory_option_enabled, test_directory,
      test_directory_makefile);
  if (!file_scopes_handled) {
    return false;
  }

  std::string const& testName = args[0];
  std::string const& var = args[var_arg_index];
  cmMakefile& mf = status.GetMakefile();
  cmTest* test = test_directory_makefile->GetTest(testName);
  if (test) {
    cmValue prop;
    if (!args[1].empty()) {
      prop = test->GetProperty(args[1]);
    }
    if (prop) {
      mf.AddDefinition(var, prop);
      return true;
    }
  }
  mf.AddDefinition(var, "NOTFOUND");
  return true;
}